

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogExecution.cpp
# Opt level: O0

void __thiscall wasm::LogExecution::run(LogExecution *this,Module *module)

{
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  string local_48;
  IString local_28;
  Module *local_18;
  Module *module_local;
  LogExecution *this_local;
  
  local_18 = module;
  module_local = (Module *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"log-execution",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"",&local_a1);
  Pass::getArgumentOrDefault(&local_48,(Pass *)this,&local_68,&local_a0);
  IString::IString(&local_28,&local_48);
  IString::operator=(&this->loggerModule,&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  WalkerPass<wasm::PostWalker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>_>::run
            (&this->
              super_WalkerPass<wasm::PostWalker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>_>
             ,local_18);
  return;
}

Assistant:

void run(Module* module) override {
    loggerModule = getArgumentOrDefault("log-execution", "");
    Super::run(module);
  }